

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O2

Matrix3d * __thiscall Pose::QtoR(Matrix3d *__return_storage_ptr__,Pose *this,Vector4d *Q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double R33;
  double R23;
  double R13;
  double R32;
  double R22;
  double R31;
  double R21;
  double R12;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_28;
  
  dVar7 = (Q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  dVar1 = (Q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  dVar3 = (Q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  dVar6 = dVar1 * dVar1 * -2.0;
  dVar8 = dVar7 + dVar7;
  dVar5 = (dVar1 + dVar1) * dVar2;
  dVar9 = dVar2 * dVar2 * -2.0;
  dVar11 = (dVar2 + dVar2) * dVar3;
  R21 = dVar8 * dVar1 + dVar11;
  dVar10 = (dVar1 + dVar1) * dVar3;
  R31 = dVar8 * dVar2 - dVar10;
  R12 = dVar8 * dVar1 - dVar11;
  dVar7 = 1.0 - (dVar7 * dVar7 + dVar7 * dVar7);
  R22 = dVar9 + dVar7;
  R32 = dVar5 + dVar8 * dVar3;
  R13 = dVar8 * dVar2 + dVar10;
  R23 = dVar5 - dVar8 * dVar3;
  R33 = dVar7 + dVar6;
  local_28.m_row = 0;
  local_28.m_col = 1;
  local_28.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = dVar6 + 1.0 + dVar9;
  local_28.m_xpr = __return_storage_ptr__;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(&local_28,&R12)
  ;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&R13);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&R21);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&R22);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&R23);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&R31);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&R32);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&R33);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Matrix3d Pose::QtoR(Vector4d Q){
      // Transform quaternion to rotation matrix
      double x, y, z, w;
      double R11, R21, R31, R12, R22, R32, R13, R23, R33;
      // Read components of quaternion
      x = Q(0);
      y = Q(1);
      z = Q(2);
      w = Q(3);
      // R11 = 1 - 2y^2 - 2z^2
      R11 = 1 - 2*pow(y,2) - 2*pow(z,2);
      // R21 = 2xy + 2zw
      R21 = 2*x*y + 2*z*w;
      // R31 = 2xz - 2yw
      R31 = 2*x*z - 2*y*w;
      // R12 = 2xy - 2zw
      R12 = 2*x*y - 2*z*w;
      // R22 = 1 - 2x^2 - 2z^2
      R22 = 1 - 2*pow(x,2) - 2*pow(z,2);
      // R32 = 2yz + 2xw
      R32 = 2*y*z + 2*x*w;
      // R13 = 2xz + 2yw
      R13 = 2*x*z + 2*y*w;
      // R23 = 2yz - 2xw
      R23 = 2*y*z - 2*x*w;
      // R33 = 1 - 2x^2 - 2y^2
      R33 = 1 - 2*pow(x,2) - 2*pow(y,2);
      // Define rotation matrix
      Matrix3d R;
      R <<  R11, R12, R13,
            R21, R22, R23,
            R31, R32, R33;
      // Return rotation matrix
      return R;
}